

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CncFileDescriptor.h
# Opt level: O2

AtomicBuffer *
aeron::CncFileDescriptor::createToDriverBuffer(AtomicBuffer *__return_storage_ptr__,ptr_t *cncFile)

{
  length_t lVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  
  puVar2 = util::MemoryMappedFile::getMemoryPtr
                     ((cncFile->
                      super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>)
                      ._M_ptr);
  util::MemoryMappedFile::getMemorySize
            ((cncFile->super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  puVar3 = util::MemoryMappedFile::getMemoryPtr
                     ((cncFile->
                      super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>)
                      ._M_ptr);
  puVar3 = puVar3 + META_DATA_LENGTH;
  lVar1 = *(length_t *)(puVar2 + 4);
  __return_storage_ptr__->_vptr_AtomicBuffer = (_func_int **)&PTR__AtomicBuffer_0016f200;
  __return_storage_ptr__->m_buffer = puVar3;
  __return_storage_ptr__->m_length = lVar1;
  return __return_storage_ptr__;
}

Assistant:

inline static AtomicBuffer createToDriverBuffer(MemoryMappedFile::ptr_t cncFile)
{
    AtomicBuffer metaDataBuffer(cncFile->getMemoryPtr(), convertSizeToIndex(cncFile->getMemorySize()));

    const MetaDataDefn& metaData = metaDataBuffer.overlayStruct<MetaDataDefn>(0);

    return AtomicBuffer(cncFile->getMemoryPtr() + META_DATA_LENGTH, metaData.toDriverBufferLength);
}